

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Error __thiscall asmjit::CodeEmitter::commentv(CodeEmitter *this,char *fmt,__va_list_tag *ap)

{
  long in_RDI;
  Error err;
  __va_list_tag *in_stack_000003d8;
  char *in_stack_000003e0;
  Logger *in_stack_000003e8;
  undefined4 local_24;
  undefined4 local_4;
  
  local_24 = *(Error *)(in_RDI + 0x2c);
  local_4 = local_24;
  if (local_24 == 0) {
    if ((*(uint *)(in_RDI + 0x38) & 4) != 0) {
      local_24 = Logger::logv(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

Error CodeEmitter::commentv(const char* fmt, va_list ap) {
  Error err = _lastError;
  if (err) return err;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    err = _code->_logger->logv(fmt, ap);
#else
  ASMJIT_UNUSED(fmt);
  ASMJIT_UNUSED(ap);
#endif

  return err;
}